

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O3

size_t ComputeShortestPathFromNodes(size_t num_bytes,ZopfliNode *nodes)

{
  ZopfliNode *pZVar1;
  size_t sVar2;
  uint uVar3;
  
  uVar3 = nodes[num_bytes].dcode_insert_length;
  for (pZVar1 = nodes + num_bytes; ((uVar3 & 0x7ffffff) == 0 && (pZVar1->length == 1));
      pZVar1 = pZVar1 + -1) {
    num_bytes = num_bytes - 1;
    uVar3 = pZVar1[-1].dcode_insert_length;
  }
  (pZVar1->u).next = 0xffffffff;
  sVar2 = 0;
  while (num_bytes != 0) {
    uVar3 = (nodes[num_bytes].dcode_insert_length & 0x7ffffff) +
            (nodes[num_bytes].length & 0x1ffffff);
    num_bytes = num_bytes - uVar3;
    nodes[num_bytes].u.next = uVar3;
    sVar2 = sVar2 + 1;
  }
  return sVar2;
}

Assistant:

static size_t ComputeShortestPathFromNodes(size_t num_bytes,
    ZopfliNode* nodes) {
  size_t index = num_bytes;
  size_t num_commands = 0;
  while ((nodes[index].dcode_insert_length & 0x7FFFFFF) == 0 &&
      nodes[index].length == 1) --index;
  nodes[index].u.next = BROTLI_UINT32_MAX;
  while (index != 0) {
    size_t len = ZopfliNodeCommandLength(&nodes[index]);
    index -= len;
    nodes[index].u.next = (uint32_t)len;
    num_commands++;
  }
  return num_commands;
}